

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample-sort.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  *this;
  SaveBlock save;
  LoadBlock load_;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  _Manager_type p_Var4;
  time_t tVar5;
  Block<float> *this_00;
  ulong uVar6;
  size_type __new_size;
  void *b;
  Link *pLVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  _Invoker_type in_stack_ffffffffffffe468;
  undefined6 uStack_1b90;
  bool verify;
  bool print;
  int nblocks;
  undefined2 uStack_1b84;
  bool help;
  bool verbose;
  int chunk_size;
  int num_samples;
  undefined8 local_1b78;
  QueuePolicy *in_stack_ffffffffffffe490;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1b68;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1b60;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1b58;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1b50;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1b48;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1b40;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1b38;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1b30;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1b28;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1b20;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1b18;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1b10;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1b08;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_1b00;
  Value max;
  Value min;
  int threads;
  int mem_blocks;
  int k;
  environment env;
  communicator world;
  vector<int,_std::allocator<int>_> gids;
  size_t num_values;
  int local_1a9c;
  file in;
  string infile;
  vector<int,_std::allocator<int>_> shape;
  BOV reader;
  code *local_19e0 [2];
  code *local_19d0;
  code *local_19c8;
  code *local_19c0 [2];
  code *local_19b0;
  code *local_19a8;
  code *local_19a0 [2];
  code *local_1990;
  code *local_1988;
  code *local_1980 [2];
  code *local_1970;
  code *local_1968;
  ContiguousAssigner assigner;
  communicator local_1940;
  DiscreteBounds block_bounds;
  string local_1880;
  string local_1860;
  string local_1840;
  string local_1820;
  string local_1800;
  string local_17e0;
  string local_17c0;
  string prefix;
  FileStorage storage;
  Options ops;
  _Any_data local_16c8;
  code *local_16b8;
  code *local_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  code *local_1698;
  code *local_1690;
  undefined8 local_1688;
  undefined8 uStack_1680;
  code *local_1678;
  code *local_1670;
  Master master;
  
  diy::mpi::environment::environment(&env,argc,argv);
  diy::mpi::communicator::communicator(&world);
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this = &ops.options;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.failed = false;
  nblocks = world.size_;
  num_values = 100;
  k = 2;
  mem_blocks = -1;
  num_samples = 8;
  iVar10 = 1;
  chunk_size = iVar10;
  threads = iVar10;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.args.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&prefix,"./DIY.XXXXXX",(allocator<char> *)&master);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&master,"print",(allocator<char> *)&assigner);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&block_bounds,"print the result",(allocator<char> *)&local_17c0);
  opts::Option<bool>((opts *)&local_1b00,(string *)&master,&print,(string *)&block_bounds);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1b00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&storage,"verbose",(allocator<char> *)&local_17e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reader,"verbose output",(allocator<char> *)&local_1800);
  opts::Option<bool>((opts *)&local_1b08,'v',(string *)&storage,&verbose,(string *)&reader);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1b08);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&infile,"verify",(allocator<char> *)&local_1820);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in,"verify the result",(allocator<char> *)&local_1840);
  opts::Option<bool>((opts *)&local_1b10,&infile,&verify,(string *)&in);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1b10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gids,"help",(allocator<char> *)&local_1860);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shape,"show help",(allocator<char> *)&local_1880);
  opts::Option<bool>((opts *)&local_1b18,'h',(string *)&gids,&help,(string *)&shape);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1b18);
  if (local_1b18._M_head_impl != (BasicOption *)0x0) {
    (*(local_1b18._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1b18._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&shape);
  std::__cxx11::string::~string((string *)&gids);
  if (local_1b10._M_head_impl != (BasicOption *)0x0) {
    (*(local_1b10._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1b10._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&in);
  std::__cxx11::string::~string((string *)&infile);
  if (local_1b08._M_head_impl != (BasicOption *)0x0) {
    (*(local_1b08._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1b08._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&storage);
  if (local_1b00._M_head_impl != (BasicOption *)0x0) {
    (*(local_1b00._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1b00._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&block_bounds);
  std::__cxx11::string::~string((string *)&master);
  min = 0.0;
  max = 1048576.0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&master,"number",(allocator<char> *)&stack0xffffffffffffe497);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&block_bounds,"number of values per block",
             (allocator<char> *)&stack0xffffffffffffe496);
  opts::Option<unsigned_long>
            ((opts *)&local_1b20,'n',(string *)&master,&num_values,(string *)&block_bounds);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1b20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&storage,"k",(allocator<char> *)&stack0xffffffffffffe495);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reader,"use k-ary swap",(allocator<char> *)&stack0xffffffffffffe494);
  opts::Option<int>((opts *)&local_1b28,'k',(string *)&storage,&k,(string *)&reader);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1b28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&infile,"samples",(allocator<char> *)&stack0xffffffffffffe493);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in,"number of samples per block",(allocator<char> *)&stack0xffffffffffffe492
            );
  opts::Option<int>((opts *)&local_1b30,'s',&infile,&num_samples,(string *)&in);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1b30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gids,"blocks",(allocator<char> *)&stack0xffffffffffffe491);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shape,"number of blocks",(allocator<char> *)&stack0xffffffffffffe490);
  opts::Option<int>((opts *)&local_1b38,'b',(string *)&gids,&nblocks,(string *)&shape);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1b38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&assigner,"thread",(allocator<char> *)((long)&local_1b78 + 7));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_17c0,"number of threads",(allocator<char> *)((long)&local_1b78 + 6));
  opts::Option<int>((opts *)&local_1b40,'t',(string *)&assigner,&threads,&local_17c0);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1b40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_17e0,"memory",(allocator<char> *)((long)&local_1b78 + 5));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1800,"number of blocks to keep in memory",
             (allocator<char> *)((long)&local_1b78 + 4));
  opts::Option<int>((opts *)&local_1b48,'m',&local_17e0,&mem_blocks,&local_1800);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1b48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1820,"chunk",(allocator<char> *)((long)&local_1b78 + 3));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1840,"size of a chunk in which to read the data",
             (allocator<char> *)((long)&local_1b78 + 2));
  opts::Option<int>((opts *)&local_1b50,'c',&local_1820,&chunk_size,&local_1840);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1b50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1860,"prefix",(allocator<char> *)((long)&local_1b78 + 1));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1880,"prefix for external storage",(allocator<char> *)&local_1b78);
  opts::Option<std::__cxx11::string>((opts *)&local_1b58,&local_1860,&prefix,&local_1880);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1b58);
  if (local_1b58._M_head_impl != (BasicOption *)0x0) {
    (*(local_1b58._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1b58._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_1880);
  std::__cxx11::string::~string((string *)&local_1860);
  if (local_1b50._M_head_impl != (BasicOption *)0x0) {
    (*(local_1b50._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1b50._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_1840);
  std::__cxx11::string::~string((string *)&local_1820);
  if (local_1b48._M_head_impl != (BasicOption *)0x0) {
    (*(local_1b48._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1b48._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_1800);
  std::__cxx11::string::~string((string *)&local_17e0);
  if (local_1b40._M_head_impl != (BasicOption *)0x0) {
    (*(local_1b40._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1b40._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_17c0);
  std::__cxx11::string::~string((string *)&assigner);
  if (local_1b38._M_head_impl != (BasicOption *)0x0) {
    (*(local_1b38._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1b38._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&shape);
  std::__cxx11::string::~string((string *)&gids);
  if (local_1b30._M_head_impl != (BasicOption *)0x0) {
    (*(local_1b30._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1b30._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&in);
  std::__cxx11::string::~string((string *)&infile);
  if (local_1b28._M_head_impl != (BasicOption *)0x0) {
    (*(local_1b28._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1b28._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&storage);
  if (local_1b20._M_head_impl != (BasicOption *)0x0) {
    (*(local_1b20._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1b20._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&block_bounds);
  std::__cxx11::string::~string((string *)&master);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&master,"min",(allocator<char> *)&infile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&block_bounds,"range min",(allocator<char> *)&in);
  opts::Option<float>((opts *)&local_1b60,(string *)&master,&min,(string *)&block_bounds);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1b60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&storage,"max",(allocator<char> *)&gids);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reader,"range max",(allocator<char> *)&shape);
  opts::Option<float>((opts *)&local_1b68,(string *)&storage,&max,(string *)&reader);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_1b68);
  if (local_1b68._M_head_impl != (BasicOption *)0x0) {
    (*(local_1b68._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1b68._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&storage);
  if (local_1b60._M_head_impl != (BasicOption *)0x0) {
    (*(local_1b60._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_1b60._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&block_bounds);
  std::__cxx11::string::~string((string *)&master);
  bVar1 = opts::Options::parse(&ops,argc,argv);
  if ((!bVar1) || (help == true)) {
    if (world.rank_ == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Usage: ");
      poVar3 = std::operator<<(poVar3,*argv);
      std::operator<<(poVar3," [OPTIONS] [INPUT.bov]\n");
      std::operator<<((ostream *)&std::cout,
                      "Generates random values in range [min,max] if not INPUT.bov is given.\n");
      opts::operator<<((ostream *)&std::cout,&ops);
    }
    goto LAB_001089bd;
  }
  infile._M_dataplus._M_p = (pointer)&infile.field_2;
  infile._M_string_length = 0;
  infile.field_2._M_local_buf[0] = '\0';
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&infile;
  opts::Options::operator>>
            (&ops,(PosOptionContainer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&master);
  diy::FileStorage::FileStorage(&storage,&prefix);
  iVar2 = mem_blocks;
  iVar10 = threads;
  local_1940.comm_.data = world.comm_.data;
  local_1940.owner_ = false;
  local_1980[1] = (code *)0x0;
  local_1980[0] = Block<float>::create;
  local_1968 = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
  local_1970 = std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
  local_19a0[1] = (code *)0x0;
  local_19a0[0] = Block<float>::destroy;
  local_1988 = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
  local_19c0[1] = (code *)0x0;
  local_1990 = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
  local_19c0[0] = Block<float>::save;
  local_19a8 = std::
               _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
               ::_M_invoke;
  local_19e0[1] = (code *)0x0;
  local_19b0 = std::
               _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
               ::_M_manager;
  local_19e0[0] = Block<float>::load;
  local_19c8 = std::
               _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
               ::_M_invoke;
  local_19d0 = std::
               _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
               ::_M_manager;
  p_Var4 = (_Manager_type)operator_new(0x10);
  *(undefined ***)p_Var4 = &PTR_unload_incoming_0014e298;
  *(undefined8 *)(p_Var4 + 8) = 0x1000;
  save.super__Function_base._M_functor._8_8_ = local_19e0;
  save.super__Function_base._M_functor._M_unused._M_object = local_19c0;
  save.super__Function_base._M_manager = p_Var4;
  save._M_invoker = in_stack_ffffffffffffe468;
  load_.super__Function_base._M_functor._M_pod_data[6] = verify;
  load_.super__Function_base._M_functor._0_6_ = uStack_1b90;
  load_.super__Function_base._M_functor._M_pod_data[7] = print;
  load_.super__Function_base._M_functor._8_4_ = nblocks;
  load_.super__Function_base._M_functor._12_2_ = uStack_1b84;
  load_.super__Function_base._M_functor._M_pod_data[0xe] = help;
  load_.super__Function_base._M_functor._M_pod_data[0xf] = verbose;
  load_.super__Function_base._M_manager._0_4_ = chunk_size;
  load_.super__Function_base._M_manager._4_4_ = num_samples;
  load_._M_invoker = local_1b78;
  diy::Master::Master(&master,&local_1940,iVar10,iVar2,(CreateBlock *)local_1980,
                      (DestroyBlock *)local_19a0,&storage.super_ExternalStorage,save,load_,
                      in_stack_ffffffffffffe490);
  std::_Function_base::~_Function_base((_Function_base *)local_19e0);
  std::_Function_base::~_Function_base((_Function_base *)local_19c0);
  std::_Function_base::~_Function_base((_Function_base *)local_19a0);
  std::_Function_base::~_Function_base((_Function_base *)local_1980);
  diy::mpi::communicator::~communicator(&local_1940);
  assigner.super_StaticAssigner.super_Assigner.size_ = world.size_;
  assigner.super_StaticAssigner.super_Assigner.nblocks_ = nblocks;
  assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
       (_func_int **)&PTR__Assigner_0014e380;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  diy::ContiguousAssigner::local_gids(&assigner,world.rank_,&gids);
  if (infile._M_string_length == 0) {
    uVar8 = 0;
    tVar5 = time((time_t *)0x0);
    srand((uint)tVar5);
    while( true ) {
      if ((ulong)((long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= (ulong)uVar8) break;
      iVar10 = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar8];
      this_00 = (Block<float> *)operator_new(0x40);
      (this_00->samples).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->samples).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this_00->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this_00->samples).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      this_00->bins = 0;
      pLVar7 = (Link *)operator_new(0x20);
      (pLVar7->super_Factory<diy::Link>)._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__0014e400;
      (pLVar7->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pLVar7->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pLVar7->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      Block<float>::generate_values(this_00,num_values,min,max);
      diy::Master::add(&master,iVar10,this_00,pLVar7);
      uVar8 = uVar8 + 1;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"Blocks generated");
    iVar10 = 0;
    std::endl<char,std::char_traits<char>>(poVar3);
LAB_001083ba:
    diy::sort<Block<float>,float>(&master,(Assigner *)&assigner,8,0x20,(long)num_samples,k);
    if ((print != false) || (verify == true)) {
      reader.f_ = (file *)0x0;
      reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>
                    ::_M_invoke;
      reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)std::
                           _Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>
                           ::_M_manager;
      block_bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin =
           (pointer)0x0;
      block_bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._4_4_ = 0;
      block_bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_4_ = nblocks;
      block_bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_capacity =
           (size_t)std::
                   _Function_handler<void_(Block<float>_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/reduce/sample-sort.cpp:181:20)>
                   ::_M_invoke;
      block_bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
           (pointer)std::
                    _Function_handler<void_(Block<float>_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/reduce/sample-sort.cpp:181:20)>
                    ::_M_manager;
      diy::Master::foreach_<Block<float>>
                (&master,(Callback<Block<float>_> *)&block_bounds,(Skip *)&reader);
      std::_Function_base::~_Function_base((_Function_base *)&block_bounds);
      std::_Function_base::~_Function_base((_Function_base *)&reader);
    }
    if ((print & 1U) != 0) {
      fmt::v7::print<char[17],,char>((char (*) [17])"Printing blocks\n");
      reader.f_ = (file *)0x0;
      reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>
                    ::_M_invoke;
      reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)std::
                           _Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>
                           ::_M_manager;
      block_bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin =
           (pointer)0x0;
      block_bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._1_7_ = 0;
      block_bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_1_ = verbose;
      block_bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_capacity =
           (size_t)std::
                   _Function_handler<void_(Block<float>_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/reduce/sample-sort.cpp:186:20)>
                   ::_M_invoke;
      block_bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
           (pointer)std::
                    _Function_handler<void_(Block<float>_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/reduce/sample-sort.cpp:186:20)>
                    ::_M_manager;
      diy::Master::foreach_<Block<float>>
                (&master,(Callback<Block<float>_> *)&block_bounds,(Skip *)&reader);
      std::_Function_base::~_Function_base((_Function_base *)&block_bounds);
      std::_Function_base::~_Function_base((_Function_base *)&reader);
    }
    if (verify == true) {
      fmt::v7::print<char[18],,char>((char (*) [18])"Verifying blocks\n");
      reader.f_ = (file *)Block<float>::verify_block;
      reader.shape_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      block_bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_8_ = 0;
      block_bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin =
           (pointer)0x0;
      block_bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_capacity =
           (size_t)std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                   _M_invoke;
      block_bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
           (pointer)std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>
                    ::_M_manager;
      diy::Master::foreach<void(Block<float>::*)(diy::Master::ProxyWithLink_const&)>
                (&master,(offset_in_Block<float>_to_subr *)&reader,(Skip *)&block_bounds);
      std::_Function_base::~_Function_base((_Function_base *)&block_bounds);
      local_16c8._M_unused._M_object = (void *)0x0;
      local_16c8._8_8_ = 0;
      local_16b0 = std::
                   _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                   ::_M_invoke;
      local_16b8 = std::
                   _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                   ::_M_manager;
      local_16a8 = 0;
      uStack_16a0 = 0;
      local_1690 = std::
                   _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                   ::_M_invoke;
      local_1698 = std::
                   _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                   ::_M_manager;
      local_1688 = 0;
      uStack_1680 = 0;
      local_1670 = std::
                   _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                   ::_M_invoke;
      local_1678 = std::
                   _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                   ::_M_manager;
      diy::Master::exchange(&master,false,(MemoryManagement *)&local_16c8);
      diy::MemoryManagement::~MemoryManagement((MemoryManagement *)&local_16c8);
      iVar2 = diy::Collection::available(&master.blocks_);
      diy::Master::proxy((ProxyWithLink *)&block_bounds,&master,iVar2,(IExchangeInfo *)0x0);
      diy::Master::Proxy::get<unsigned_long>((Proxy *)&block_bounds);
      poVar3 = std::operator<<((ostream *)&std::cout,"Total values: ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," vs ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      if (world.rank_ == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Blocks verified");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      diy::Master::Proxy::~Proxy((Proxy *)&block_bounds);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,world.rank_);
    poVar3 = std::operator<<(poVar3,"] Storage count:    ");
    iVar2 = diy::FileStorage::count(&storage);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,world.rank_);
    poVar3 = std::operator<<(poVar3,"] Storage max size: ");
    diy::FileStorage::max_size(&storage);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else if (nblocks % world.size_ == 0) {
    diy::mpi::io::file::file(&in,&world,&infile,2);
    uVar6 = diy::mpi::io::file::size(&in);
    uVar6 = uVar6 >> 2;
    uVar9 = uVar6 % (ulong)((long)nblocks * (long)chunk_size);
    if (uVar9 == 0) {
      shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      block_bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>._0_4_ =
           (int)(uVar6 / (ulong)(long)chunk_size);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&shape,(int *)&block_bounds);
      diy::io::BOV::BOV<std::vector<int,std::allocator<int>>>(&reader,&in,&shape,0);
      local_1a9c = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                        (long)nblocks);
      __new_size = (size_type)local_1a9c;
      uVar8 = 0;
      while( true ) {
        if ((ulong)((long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= (ulong)uVar8) break;
        iVar10 = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[uVar8];
        b = operator_new(0x40);
        *(undefined8 *)((long)b + 0x28) = 0;
        *(undefined8 *)((long)b + 0x30) = 0;
        *(undefined8 *)((long)b + 0x18) = 0;
        *(undefined8 *)((long)b + 0x20) = 0;
        *(undefined8 *)((long)b + 8) = 0;
        *(undefined8 *)((long)b + 0x10) = 0;
        *(int *)((long)b + 0x38) = num_samples;
        pLVar7 = (Link *)operator_new(0x20);
        (pLVar7->super_Factory<diy::Link>)._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__0014e400
        ;
        (pLVar7->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        (pLVar7->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        (pLVar7->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<float,_std::allocator<float>_>::resize
                  ((vector<float,_std::allocator<float>_> *)((long)b + 8),__new_size);
        diy::Bounds<int>::Bounds(&block_bounds,1);
        *block_bounds.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin =
             (local_1a9c / chunk_size) * iVar10;
        *block_bounds.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin =
             (local_1a9c / chunk_size) * (iVar10 + 1) + -1;
        diy::io::BOV::read<float>
                  (&reader,&block_bounds,
                   (((vector<float,_std::allocator<float>_> *)((long)b + 8))->
                   super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start,true,chunk_size);
        diy::Master::add(&master,iVar10,b,pLVar7);
        diy::Bounds<int>::~Bounds(&block_bounds);
        uVar8 = uVar8 + 1;
      }
      if (world.rank_ == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Array loaded");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      diy::io::BOV::~BOV(&reader);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&shape.super__Vector_base<int,_std::allocator<int>_>);
      iVar10 = 0;
    }
    else {
      iVar10 = 1;
      if (world.rank_ == 0) {
        fmt::v7::print<char[70],,char>
                  (_stderr,(char (*) [70])
                           "Expected data size to align with the number of blocks and chunk size\n")
        ;
      }
    }
    diy::mpi::io::file::~file(&in);
    if (uVar9 == 0) goto LAB_001083ba;
  }
  else {
    iVar10 = 1;
    if (world.rank_ == 0) {
      fmt::v7::print<char[87],,char>
                (_stderr,(char (*) [87])
                         "Number of blocks must be divisible by the number of processes (for collective MPI-IO)\n"
                );
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&gids.super__Vector_base<int,_std::allocator<int>_>);
  diy::Master::~Master(&master);
  diy::FileStorage::~FileStorage(&storage);
  std::__cxx11::string::~string((string *)&infile);
LAB_001089bd:
  std::__cxx11::string::~string((string *)&prefix);
  opts::Options::~Options(&ops);
  diy::mpi::communicator::~communicator(&world);
  diy::mpi::environment::~environment(&env);
  return iVar10;
}

Assistant:

int main(int argc, char* argv[])
{
  diy::mpi::environment     env(argc, argv);
  diy::mpi::communicator    world;

  using namespace opts;
  Options ops;

  int               nblocks     = world.size();
  size_t            num_values  = 100;
  int               k           = 2;
  int               num_samples = 8;
  int               mem_blocks  = -1;
  int               threads     = 1;
  int               chunk_size  = 1;
  std::string       prefix      = "./DIY.XXXXXX";

  bool print, verbose, verify, help;
  ops
      >> Option(     "print",   print,      "print the result")
      >> Option('v', "verbose", verbose,    "verbose output")
      >> Option(     "verify",  verify,     "verify the result")
      >> Option('h', "help",    help,       "show help")
  ;

  Value             min = 0,
                    max = 1 << 20;

  ops
      >> Option('n', "number",  num_values,     "number of values per block")
      >> Option('k', "k",       k,              "use k-ary swap")
      >> Option('s', "samples", num_samples,    "number of samples per block")
      >> Option('b', "blocks",  nblocks,        "number of blocks")
      >> Option('t', "thread",  threads,        "number of threads")
      >> Option('m', "memory",  mem_blocks,     "number of blocks to keep in memory")
      >> Option('c', "chunk",   chunk_size,     "size of a chunk in which to read the data")
      >> Option(     "prefix",  prefix,         "prefix for external storage")
  ;

  ops
      >> Option(     "min",     min,            "range min")
      >> Option(     "max",     max,            "range max")
  ;

  if (!ops.parse(argc,argv) || help)
  {
      if (world.rank() == 0)
      {
          std::cout << "Usage: " << argv[0] << " [OPTIONS] [INPUT.bov]\n";
          std::cout << "Generates random values in range [min,max] if not INPUT.bov is given.\n";
          std::cout << ops;
      }
      return 1;
  }

  std::string infile;
  ops >> PosOption(infile);

  diy::FileStorage          storage(prefix);
  diy::Master               master(world,
                                   threads,
                                   mem_blocks,
                                   &ValueBlock::create,
                                   &ValueBlock::destroy,
                                   &storage,
                                   &ValueBlock::save,
                                   &ValueBlock::load);

  diy::ContiguousAssigner   assigner(world.size(), nblocks);
  //diy::RoundRobinAssigner   assigner(world.size(), nblocks);

  std::vector<int> gids;
  assigner.local_gids(world.rank(), gids);

  if (infile.empty())
  {
    srand(static_cast<unsigned int>(time(0)));

    for (unsigned i = 0; i < gids.size(); ++i)
    {
      int             gid = gids[i];
      ValueBlock*     b   = new ValueBlock(0);      // bins not used in sample-sort
      Link*           l   = new Link;

      // this could be replaced by reading values from a file
      b->generate_values(num_values, min, max);

      master.add(gid, b, l);
    }
    std::cout << "Blocks generated" << std::endl;
  } else
  {
    if (nblocks % world.size() != 0)
    {
      if (world.rank() == 0)
          fmt::print(stderr, "Number of blocks must be divisible by the number of processes (for collective MPI-IO)\n");
      return 1;
    }

    // determine the size of the file, divide by sizeof(Value)
    diy::mpi::io::file in(world, infile, diy::mpi::io::file::rdonly);
    size_t sz = in.size() / sizeof(Value);

    // We have to work around a weirdness in MPI-IO. MPI expresses various
    // sizes as integers, which is too small to reference large data. So
    // instead we create a FileBlock of larger size and read in terms of those
    // blocks.
    if (sz % (chunk_size * nblocks) != 0)
    {
      if (world.rank() == 0)
          fmt::print(stderr, "Expected data size to align with the number of blocks and chunk size\n");
      return 1;
    }

    std::vector<int> shape;
    shape.push_back(static_cast<int>(sz / chunk_size));
    diy::io::BOV reader(in, shape);

    int block_size = static_cast<int>(sz) / nblocks;

    for (unsigned i = 0; i < gids.size(); ++i)
    {
      int             gid = gids[i];
      ValueBlock*     b   = new ValueBlock(num_samples);
      Link*           l   = new Link;

      // read values from a file
      b->values.resize(static_cast<size_t>(block_size));
      diy::DiscreteBounds block_bounds(1);
      block_bounds.min[0] =  gid      * (block_size / chunk_size);
      block_bounds.max[0] = (gid + 1) * (block_size / chunk_size) - 1;

      reader.read(block_bounds, &b->values[0], true, chunk_size);

      master.add(gid, b, l);
    }

    if (world.rank() == 0)
      std::cout << "Array loaded" << std::endl;
  }

  diy::sort(master, assigner,
            &ValueBlock::values,
            &ValueBlock::samples,
            num_samples,
            k);

  if (print || verify)
    master.foreach([nblocks](ValueBlock* b, const diy::Master::ProxyWithLink& cp) { set_min_max(b, cp, nblocks); });

  if (print)
  {
    fmt::print("Printing blocks\n");
    master.foreach([verbose](ValueBlock* b, const diy::Master::ProxyWithLink& cp) { b->print_block(cp, verbose); });
  }
  if (verify)
  {
    fmt::print("Verifying blocks\n");
    master.foreach(&ValueBlock::verify_block);

    master.exchange();      // to process collectives
    typedef diy::Master::ProxyWithLink      Proxy;
    int     idx   = master.loaded_block();
    Proxy   proxy = master.proxy(idx);
    size_t  total = proxy.get<size_t>();
    std::cout << "Total values: " << total << " vs " << nblocks * num_values << std::endl;

    if (world.rank() == 0)
      std::cout << "Blocks verified" << std::endl;
  }

  std::cout << "[" << world.rank() << "] Storage count:    " << storage.count() << std::endl;
  std::cout << "[" << world.rank() << "] Storage max size: " << storage.max_size() << std::endl;
}